

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference
          (DescriptorScriptReference *this,Address *address_script,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *address_prefixes)

{
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *address_prefixes_local;
  Address *address_script_local;
  DescriptorScriptReference *this_local;
  
  this->script_type_ = kDescriptorScriptAddr;
  core::Address::GetLockingScript(&this->locking_script_,address_script);
  this->is_script_ = false;
  Script::Script(&this->redeem_script_);
  core::Address::Address(&this->address_script_,address_script);
  TapBranch::TapBranch(&this->tapbranch_);
  this->is_tapbranch_ = false;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  ::std::shared_ptr<cfd::core::DescriptorScriptReference>::shared_ptr
            (&this->child_script_,(nullptr_t)0x0);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  vector(&this->keys_);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&this->addr_prefixes_,address_prefixes);
  return;
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference(
    const Address& address_script,
    const std::vector<AddressFormatData>& address_prefixes)
    : script_type_(DescriptorScriptType::kDescriptorScriptAddr),
      locking_script_(address_script.GetLockingScript()),
      is_script_(false),
      address_script_(address_script),
      is_tapbranch_(false),
      addr_prefixes_(address_prefixes) {
  // do nothing
}